

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompileTest.cpp
# Opt level: O2

void CompiledMixedType<char,unsigned_int>(void)

{
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> SVar1;
  uint uVar2;
  uint u;
  uint local_34;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> st2;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> local_2d;
  SafeInt<unsigned_int,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_> su;
  
  u = 0;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_int>(&local_2d,&u);
  su.m_int = u;
  SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::
  SafeInt<unsigned_int>(&st2,&su);
  local_2d.m_int = '\0';
  SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
            ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>> *)
             &local_2d,&u);
  if (su.m_int < 0x80) {
    local_2d.m_int = st2.m_int;
    SafeInt::operator_cast_to_unsigned_int((SafeInt *)&local_2d);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator*
              (&local_2d,st2);
    operator*(u,local_2d);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator*=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,su);
    uVar2 = 1;
    u = uVar2;
    local_34 = uVar2;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,(int *)&local_34);
    local_34 = uVar2;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_34);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    local_34 = uVar2;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_34);
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator%
              (&local_2d,st2);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator%=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,su);
    u = uVar2;
    local_34 = uVar2;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_34);
    local_34 = uVar2;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,(int *)&local_34);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator/
              (&local_2d,st2);
    operator/(u,local_2d);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator/=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,su);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator+
              (&local_2d,st2);
    operator+(u,local_2d);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator+=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,su);
    local_34 = 0;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,(int *)&local_34);
    u = 0;
    local_34 = 0;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&st2,(int *)&local_34);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator-
              (&local_2d,st2);
    operator-(u,local_2d);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    local_34 = uVar2;
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,(int *)&local_34);
    local_34 = uVar2;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_34);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator-=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,su);
    u = uVar2;
    local_34 = uVar2;
    SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
    operator=((SafeInt<unsigned_int,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               *)&su,(int *)&local_34);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SVar1 = SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator<<((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_2d,su);
    operator<<(SVar1.m_int,su);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator<<=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,su);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SVar1 = SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::
            operator>>((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                        *)&local_2d,su);
    operator>>(SVar1.m_int,su);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,u);
    SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>::operator>>=
              ((SafeInt<char,safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
                *)&local_2d,su);
    SafeInt<char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>::operator&
              (&local_2d,st2);
    local_34 = BinaryAndHelper<unsigned_int,_char,_1>::And(su.m_int,local_2d.m_int & (byte)u);
    SafeInt::operator_cast_to_char((SafeInt *)&local_34);
    local_2d.m_int = (byte)su.m_int & (byte)u & local_2d.m_int & st2.m_int;
    local_34 = BinaryOrHelper<unsigned_int,_char,_1>::Or(su.m_int,(byte)u);
    SafeInt::operator_cast_to_char((SafeInt *)&local_34);
    local_2d.m_int = (byte)su.m_int | (byte)u | local_2d.m_int | st2.m_int;
    local_34 = BinaryXorHelper<unsigned_int,_char,_1>::Xor(su.m_int,local_2d.m_int ^ (byte)u);
    SafeInt::operator_cast_to_char((SafeInt *)&local_34);
    return;
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

void CompiledMixedType()
{
	// Mixed constructors
	U u = 0;
	T t = 0;
	bool b = false;
	SafeInt<T> st(u);
	SafeInt<U> su(u);
	SafeInt<T> st2(su);

	// Shut up the compiler
	b = !b;

	// Assignment
	st = t;
	st = u;
	st = su;
	st = st2;

	// Casting
	U u2 = (U)st;

	// Multiplication
	t = st * u;
	t = st * st2;
	t = u * st;
	st *= u;
	st *= su;

	// Modulus, modulus assignment
	u = 1;
	st = 1;
	su = 1;
	// For some reason, this is annoying the VS17 link time code generation
//	t = u % st;

	t = st % u;
	st2 = 1;
	t = st % st2;
	st %= u;
	st %= su;

	// Division
	u = 1;
	st2 = 1;
	st = 1;
	t = st / u;
	t = st / st2;
	t = u / st;
	st /= u;
	st /= su;

	// Addition
	t = st + u;
	t = st + st2;
	t = u + st;
	st += u;
	st += su;

	// Subtraction
	st = 0;
	u = 0;
	st2 = 0;
	t = st - u;
	t = st - st2;
	t = u - st;
	st -= u;

	st = 1;
	su = 1;
	st -= su;

	// Shift operators
	u = 1;
	su = 1;
	// Left
	t = st << u;
	t = st << su;
	t = t << su;

	st <<= u;
	st <<= su;

	// Right
	t = st >> u;
	t = st >> su;
	t = t >> su;

	st >>= u;
	st >>= su;

	// Binary operations
	// And
	t = st & st2;
	t = st & u;
	t = t & su;

	st &= st2;
	st &= u;
	st &= su;

	// Or
	t = st | st2;
	t = st | u;
	t = t | su;

	st |= st2;
	st |= u;
	st |= su;

	// Xor
	t = st ^ st2;
	t = st ^ u;
	t = t ^ su;

	st ^= st2;
	st ^= u;
	st ^= su;

	// Comparisons
	// Less than
	b = st < su;
	b = st < u;
	b = u < st;
	b = st < su;

	// Less than or equal
	b = st <= su;
	b = st <= u;
	b = u <= st;
	b = st <= su;

	// Greater than
	b = st > su;
	b = st > u;
	b = u > st;
	b = st > su;

	// Greater than or equal
	b = st >= su;
	b = st >= u;
	b = u >= st;
	b = st >= su;

	// Equals
	b = st == su;
	b = st == u;
	b = u == st;
	b = st == su;
}